

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

void __thiscall
QCss::ValueExtractor::borderValue
          (ValueExtractor *this,Declaration *decl,int *width,BorderStyle *style,QBrush *color)

{
  DeclarationData *pDVar1;
  ulong uVar2;
  Value *v;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  QColor color_00;
  QMetaType QVar4;
  DataPtr DVar5;
  _Head_base<0UL,_QBrushData_*,_false> _Var6;
  bool bVar7;
  BorderStyle BVar8;
  int iVar9;
  QMetaType QVar10;
  ValueExtractor *this_00;
  uint uVar11;
  PrivateShared *pPVar12;
  long in_FS_OFFSET;
  LengthData LVar13;
  undefined1 local_98 [8];
  ulong uStack_90;
  undefined1 *puStack_88;
  undefined1 local_80 [24];
  undefined4 local_68;
  undefined2 uStack_64;
  undefined8 uStack_62;
  undefined2 uStack_5a;
  undefined1 local_58 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (decl->d).d.ptr;
  uVar2 = *(ulong *)&(pDVar1->parsed).d.field_0x18;
  if (uVar2 < 4) {
    uVar11 = 0;
    *width = 0;
    *style = BorderStyle_None;
    local_68 = 0;
    uStack_64 = 0xffff;
    uStack_62 = 0;
    color_00._14_2_ = uStack_5a;
    color_00.cspec = SUB144(ZEXT614(0xffff00000000),0);
    color_00.ct = (CT)SUB1410(ZEXT614(0xffff00000000),4);
    QBrush::operator=(color,color_00);
    if ((((decl->d).d.ptr)->values).d.size == 0) goto LAB_005e74de;
    this_00 = (ValueExtractor *)local_80;
    local_98 = (undefined1  [8])0xffffffffffffffff;
    uStack_90 = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBrush::QBrush((QBrush *)this_00);
    local_80._8_8_ = (Declaration *)0x11;
    local_98 = (undefined1  [8])0x0;
    uStack_90 = uStack_90 & 0xffffffff00000000;
    puStack_88 = (undefined1 *)CONCAT44(puStack_88._4_4_,1);
    v = (((decl->d).d.ptr)->values).d.ptr;
    if ((v->type | Percentage) == Length) {
      LVar13 = lengthValue(this_00,v);
      local_98 = (undefined1  [8])LVar13.number;
      uStack_90 = CONCAT44(uStack_90._4_4_,LVar13.unit);
      iVar9 = lengthValueFromData((LengthData *)local_98,&this->f);
      *width = iVar9;
      uVar11 = 1;
      if (1 < (ulong)(((decl->d).d.ptr)->values).d.size) goto LAB_005e737a;
LAB_005e73b4:
      ::QVariant::QVariant((QVariant *)local_58,(QMetaType)0x809378,local_98);
      ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)local_58);
      ::QVariant::~QVariant((QVariant *)local_58);
    }
    else {
LAB_005e737a:
      BVar8 = parseStyleValue((Value *)((long)&((((decl->d).d.ptr)->values).d.ptr)->type +
                                       (ulong)(uVar11 * 0x28)));
      puStack_88 = (undefined1 *)CONCAT44(puStack_88._4_4_,BVar8);
      if (BVar8 == BorderStyle_Unknown) {
        puStack_88 = (undefined1 *)CONCAT44(puStack_88._4_4_,1);
      }
      else {
        *style = BVar8;
        uVar11 = uVar11 + 1;
        if ((ulong)(((decl->d).d.ptr)->values).d.size <= (ulong)uVar11) goto LAB_005e73b4;
      }
      parseBrushValue((Value *)local_58,
                      (QPalette *)
                      ((long)&((((decl->d).d.ptr)->values).d.ptr)->type + (ulong)(uVar11 * 0x28)));
      DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_2_ = local_58._4_2_;
      DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_ = local_58._0_4_;
      DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._6_2_ = local_58._6_2_;
      local_80._8_8_ = CONCAT26(aStack_50._6_2_,aStack_50._0_6_);
      local_58._0_4_ = (undefined4)local_80._0_8_;
      local_58._4_2_ = SUB82(local_80._0_8_,4);
      local_58._6_2_ = SUB82(local_80._0_8_,6);
      local_80._0_8_ =
           DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      QBrush::~QBrush((QBrush *)local_58);
      if (local_80._12_4_ != 0) {
        brushFromData((BrushData *)local_58,(QPalette *)local_80);
        _Var3._M_head_impl =
             (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        _Var6._M_head_impl._4_2_ = local_58._4_2_;
        _Var6._M_head_impl._0_4_ = local_58._0_4_;
        _Var6._M_head_impl._6_2_ = local_58._6_2_;
        (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = _Var6._M_head_impl;
        local_58._0_4_ = SUB84(_Var3._M_head_impl,0);
        local_58._4_2_ = (undefined2)((ulong)_Var3._M_head_impl >> 0x20);
        local_58._6_2_ = (undefined2)((ulong)_Var3._M_head_impl >> 0x30);
        QBrush::~QBrush((QBrush *)local_58);
        if (local_80._12_4_ != 3) {
          ::QVariant::QVariant((QVariant *)local_58,(QMetaType)0x809378,local_98);
          ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)local_58);
          ::QVariant::~QVariant((QVariant *)local_58);
        }
      }
    }
  }
  else {
    pPVar12 = (PrivateShared *)&pDVar1->parsed;
    local_98 = (undefined1  [8])0xffffffffffffffff;
    uStack_90 = (ulong)&DAT_aaaaaaaaaaaaaaaa;
    puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_4_ = 0x809378;
    local_58._4_2_ = 0;
    local_58._6_2_ = 0;
    local_80._16_8_ = uVar2 & 0xfffffffffffffffc;
    bVar7 = comparesEqual((QMetaType *)(local_80 + 0x10),(QMetaType *)local_58);
    if (bVar7) {
      if (((pDVar1->parsed).d.field_0x18 & 1) != 0) {
        pPVar12 = (((QVariant *)pPVar12)->d).data.shared;
        pPVar12 = pPVar12 + *(int *)(pPVar12 + 4);
      }
      puStack_88 = (undefined1 *)CONCAT44(puStack_88._4_4_,*(undefined4 *)&pPVar12[0x10].field_0x0);
      local_98 = (undefined1  [8])(((Private *)&pPVar12->field_0x0)->data).shared;
      uStack_90 = *(ulong *)&pPVar12[8].field_0x0;
      QBrush::QBrush((QBrush *)local_80,(QBrush *)(pPVar12 + 0x18));
      local_80._8_8_ = *(undefined8 *)(pPVar12 + 0x20);
    }
    else {
      local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = (undefined1  [8])0x0;
      uStack_90 = 0xaaaaaaaa00000000;
      puStack_88 = (undefined1 *)0xaaaaaaaa00000000;
      QBrush::QBrush((QBrush *)local_80);
      local_80._8_8_ = (Declaration *)0x11;
      QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((pDVar1->parsed).d.field_0x18 & 1) != 0) {
        pPVar12 = (((QVariant *)pPVar12)->d).data.shared;
        pPVar12 = pPVar12 + *(int *)(pPVar12 + 4);
      }
      QVar4.d_ptr._4_2_ = local_58._4_2_;
      QVar4.d_ptr._0_4_ = local_58._0_4_;
      QVar4.d_ptr._6_2_ = local_58._6_2_;
      QMetaType::convert(QVar10,pPVar12,QVar4,local_98);
    }
    iVar9 = lengthValueFromData((LengthData *)local_98,&this->f);
    *width = iVar9;
    *style = (BorderStyle)puStack_88;
    if (local_80._12_4_ == 0) {
      local_58._0_4_ = 0;
      local_58._4_2_ = 0xffff;
      local_58._6_2_ = 0;
      aStack_50._0_6_ = 0;
      QBrush::QBrush((QBrush *)(local_80 + 0x10),(QColor *)local_58,SolidPattern);
    }
    else {
      brushFromData((BrushData *)(local_80 + 0x10),(QPalette *)local_80);
    }
    _Var3._M_head_impl =
         (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_80._16_8_;
    local_80._16_8_ = _Var3._M_head_impl;
    QBrush::~QBrush((QBrush *)(local_80 + 0x10));
  }
  QBrush::~QBrush((QBrush *)local_80);
LAB_005e74de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValueExtractor::borderValue(const Declaration &decl, int *width, QCss::BorderStyle *style, QBrush *color)
{
    if (decl.d->parsed.isValid()) {
        BorderData data = qvariant_cast<BorderData>(decl.d->parsed);
        *width = lengthValueFromData(data.width, f);
        *style = data.style;
        *color = data.color.type != BrushData::Invalid ? brushFromData(data.color, pal) : QBrush(QColor());
        return;
    }

    *width = 0;
    *style = BorderStyle_None;
    *color = QColor();

    if (decl.d->values.isEmpty())
        return;

    BorderData data;
    data.width.number = 0;
    data.width.unit = LengthData::None;
    data.style = BorderStyle_None;

    int i = 0;
    if (decl.d->values.at(i).type == Value::Length || decl.d->values.at(i).type == Value::Number) {
        data.width = lengthValue(decl.d->values.at(i));
        *width = lengthValueFromData(data.width, f);
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    }

    data.style = parseStyleValue(decl.d->values.at(i));
    if (data.style != BorderStyle_Unknown) {
        *style = data.style;
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    } else {
        data.style = BorderStyle_None;
    }

     data.color = parseBrushValue(decl.d->values.at(i), pal);
    if (data.color.type != BrushData::Invalid) {
        *color = brushFromData(data.color, pal);
        if (data.color.type != BrushData::DependsOnThePalette)
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
    }
}